

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamEuler.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamEuler::ComputeInternalForces
          (ChElementBeamEuler *this,ChVectorDynamic<> *Fi)

{
  ChMatrixDynamic<> *lhs;
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  element_type *peVar10;
  element_type *peVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  ChVectorDynamic<> *pCVar13;
  Index size;
  long lVar14;
  pointer psVar15;
  char *pcVar16;
  Index index;
  double *pdVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  ChVectorDynamic<> Fi_local;
  vector<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_> R;
  ChVectorDynamic<> displ_dt;
  ChVectorDynamic<> displ;
  ChMatrixDynamic<> FiR_local;
  ChVector<double> mFcent_i;
  ChVector<double> mTgyro_i;
  ChMatrix33<double> AtolocwelA;
  ChMatrix33<double> AtolocwelB;
  ChMatrix33<double> Atoabs;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_370;
  vector<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_> local_360;
  ChVectorDynamic<> *local_348;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_340;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_330;
  Matrix<double,__1,__1,_1,__1,__1> local_318;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_300;
  ChElementBeamEuler *local_2c0;
  double local_2b8;
  long local_2b0;
  double local_2a8 [7];
  ChMatrix33<double> local_270;
  ChMatrixRef local_220;
  ChMatrix33<double> local_1e0;
  double adStack_198 [3];
  ChMatrix33<double> local_180 [4];
  
  if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows != 0xc)
  {
    __assert_fail("Fi.size() == 12",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamEuler.cpp"
                  ,0x2cb,
                  "virtual void chrono::fea::ChElementBeamEuler::ComputeInternalForces(ChVectorDynamic<> &)"
                 );
  }
  if ((this->section).
      super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    __assert_fail("section",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamEuler.cpp"
                  ,0x2cc,
                  "virtual void chrono::fea::ChElementBeamEuler::ComputeInternalForces(ChVectorDynamic<> &)"
                 );
  }
  local_330.m_storage.m_data = (double *)0x0;
  local_330.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_330,0xc);
  (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[6])
            (this,&local_330);
  local_348 = Fi;
  if ((this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
      != local_330.m_storage.m_rows) {
LAB_00675cc0:
    pcVar16 = 
    "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
    ;
LAB_00675d63:
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar16);
  }
  local_370.m_storage.m_data = (double *)0x0;
  local_370.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_370,
             (this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
             m_rows,1);
  uVar19 = (this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_rows;
  if (local_370.m_storage.m_rows != uVar19) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_370,uVar19,1);
  }
  lhs = &this->Km;
  if (-1 < local_370.m_storage.m_rows) {
    if (local_370.m_storage.m_rows != 0) {
      memset(local_370.m_storage.m_data,0,local_370.m_storage.m_rows << 3);
    }
    local_180[0].super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
    Eigen::internal::
    generic_product_impl<Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::DenseShape,Eigen::DenseShape,7>
    ::scaleAndAddTo<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&local_370,lhs,
               (Matrix<double,__1,_1,_0,__1,_1> *)&local_330,(Scalar *)local_180);
    local_340.m_storage.m_data = (double *)0x0;
    local_340.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_340,0xc);
    GetField_dt(this,(ChVectorDynamic<> *)&local_340);
    dVar8 = (double)(this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                    m_storage.m_rows;
    dVar9 = (double)(this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                    m_storage.m_cols;
    if ((long)((ulong)dVar9 | (ulong)dVar8) < 0) {
      pcVar16 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1, 1>]"
      ;
      goto LAB_00675dbb;
    }
    local_180[0].super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         ((this->section).
          super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         rdamping_beta;
    local_180[0].super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = dVar8;
    local_180[0].super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = dVar9;
    local_180[0].super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         (double)lhs;
    local_180[0].super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         (double)&local_340;
    if (dVar9 != (double)local_340.m_storage.m_rows) {
      pcVar16 = 
      "Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>, const Eigen::Matrix<double, -1, -1, 1>>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>, const Eigen::Matrix<double, -1, -1, 1>>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
      ;
      goto LAB_00675d63;
    }
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
    PlainObjectBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::Matrix<double,_1,_1,1,_1,_1>const>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&local_318,
               (DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)local_180);
    if ((local_370.m_storage.m_rows !=
         local_318.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
        ) || (local_318.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
              m_cols != 1)) {
LAB_00675cda:
      __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, -1, 1>, Functor = Eigen::internal::add_assign_op<double, double>]"
                   );
    }
    if (0 < local_370.m_storage.m_rows) {
      uVar19 = 0;
      pdVar17 = local_318.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
                .m_data;
      do {
        local_370.m_storage.m_data[uVar19] = *pdVar17 + local_370.m_storage.m_data[uVar19];
        uVar19 = uVar19 + 1;
        pdVar17 = pdVar17 + 1;
      } while (local_370.m_storage.m_rows != uVar19);
    }
    dVar8 = ((this->section).
             super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->rdamping_alpha;
    if ((dVar8 != 0.0) || (NAN(dVar8))) {
      local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
      local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
      local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
                ((DenseStorage<double,__1,__1,__1,_1> *)&local_270,0x90,0xc,0xc);
      local_180[0].super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      local_180[0].super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      local_180[0].super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
      if ((long)((ulong)local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array[2] |
                (ulong)local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[1]) < 0) {
        pcVar16 = 
        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
        ;
        goto LAB_00675dbb;
      }
      Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                ((Matrix<double,__1,__1,_1,__1,__1> *)&local_270,
                 (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                  *)local_180,(assign_op<double,_double> *)&local_1e0);
      peVar10 = (this->section).
                super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      (*(peVar10->super_ChBeamSection)._vptr_ChBeamSection[0xd])(peVar10,local_180);
      if ((this->nodes).
          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->nodes).
          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        dVar8 = (this->super_ChElementBeam).length * 0.5 *
                ((this->section).
                 super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->rdamping_alpha;
        lVar14 = 0;
        uVar19 = 0;
        do {
          lVar20 = uVar19 * 6 + 6;
          if (((long)local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[1] < lVar20) ||
             ((long)local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[2] < lVar20)) {
            __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                          ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,
                          "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 6, 6>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 6, BlockCols = 6, InnerPanel = false]"
                         );
          }
          pdVar17 = (double *)
                    ((long)local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array[0] +
                    ((long)local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array[2] + 1U) * lVar14 + 0x20);
          lVar20 = 0x20;
          do {
            dVar9 = *(double *)((long)adStack_198 + lVar20);
            pdVar17[-4] = dVar8 * *(double *)
                                   ((long)local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                          .m_storage.m_data.array + lVar20 + 0x40) + pdVar17[-4];
            pdVar17[-3] = dVar8 * dVar9 + pdVar17[-3];
            dVar9 = *(double *)((long)adStack_198 + lVar20 + 0x10);
            pdVar17[-2] = dVar8 * *(double *)((long)adStack_198 + lVar20 + 8) + pdVar17[-2];
            pdVar17[-1] = dVar8 * dVar9 + pdVar17[-1];
            dVar9 = *(double *)
                     ((long)local_180[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array + lVar20 + 8);
            *pdVar17 = dVar8 * *(double *)
                                ((long)local_180[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                       m_storage.m_data.array + lVar20) + *pdVar17;
            pdVar17[1] = dVar8 * dVar9 + pdVar17[1];
            lVar20 = lVar20 + 0x30;
            pdVar17 = pdVar17 + (long)local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                      m_storage.m_data.array[2];
          } while (lVar20 != 0x140);
          uVar19 = uVar19 + 1;
          lVar14 = lVar14 + 0x30;
        } while (uVar19 < (ulong)((long)(this->nodes).
                                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->nodes).
                                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
      if (local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] !=
          (double)local_340.m_storage.m_rows) goto LAB_00675cc0;
      local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           (double)&local_270;
      local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           (double)&local_340;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>,Eigen::internal::assign_op<double,double>>
                (&local_318,
                 (Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                  *)&local_1e0,(assign_op<double,_double> *)&local_300,(type)0x0);
      if ((local_370.m_storage.m_rows !=
           local_318.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_rows) ||
         (local_318.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_cols != 1)) goto LAB_00675cda;
      if (0 < local_370.m_storage.m_rows) {
        uVar19 = 0;
        pdVar17 = local_318.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        do {
          local_370.m_storage.m_data[uVar19] = *pdVar17 + local_370.m_storage.m_data[uVar19];
          uVar19 = uVar19 + 1;
          pdVar17 = pdVar17 + 1;
        } while (local_370.m_storage.m_rows != uVar19);
      }
      if ((double *)
          local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] !=
          (double *)0x0) {
        free(*(void **)((long)local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array[0] + -8));
      }
    }
    if (-1 < local_370.m_storage.m_rows) {
      uVar19 = local_370.m_storage.m_rows & 0x7ffffffffffffff8;
      if (7 < local_370.m_storage.m_rows) {
        uVar18 = 0;
        auVar22 = vbroadcastsd_avx512f(ZEXT816(0x8000000000000000));
        do {
          auVar23 = vxorpd_avx512dq(auVar22,*(undefined1 (*) [64])
                                             (local_370.m_storage.m_data + uVar18));
          *(undefined1 (*) [64])(local_370.m_storage.m_data + uVar18) = auVar23;
          uVar18 = uVar18 + 8;
        } while (uVar18 < uVar19);
      }
      if ((long)uVar19 < local_370.m_storage.m_rows) {
        do {
          auVar27._0_8_ = -local_370.m_storage.m_data[uVar19];
          auVar27._8_8_ = 0x8000000000000000;
          dVar8 = (double)vmovlpd_avx(auVar27);
          local_370.m_storage.m_data[uVar19] = dVar8;
          uVar19 = uVar19 + 1;
        } while (local_370.m_storage.m_rows != uVar19);
      }
      ChMatrix33<double>::ChMatrix33(local_180,&this->q_element_abs_rot);
      psVar15 = (this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar11 = (psVar15->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      p_Var12 = (psVar15->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
        }
      }
      auVar24._8_8_ = 0;
      auVar24._0_8_ = *(ulong *)&peVar11->field_0x38;
      dVar8 = *(double *)&peVar11->field_0x40;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = dVar8;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = *(double *)&peVar11->field_0x48;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = *(double *)&peVar11->field_0x50;
      dVar9 = (this->q_element_abs_rot).m_data[0];
      auVar39._8_8_ = 0;
      auVar39._0_8_ = dVar9;
      dVar1 = (this->q_element_abs_rot).m_data[1];
      auVar42._8_8_ = 0;
      auVar42._0_8_ = dVar1;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = dVar8 * dVar1;
      auVar27 = vfmadd231sd_fma(auVar44,auVar24,auVar39);
      auVar46._8_8_ = 0;
      auVar46._0_8_ = (this->q_element_abs_rot).m_data[2];
      auVar27 = vfmadd231sd_fma(auVar27,auVar31,auVar46);
      auVar48._8_8_ = 0;
      auVar48._0_8_ = (this->q_element_abs_rot).m_data[3];
      auVar27 = vfmadd231sd_fma(auVar27,auVar34,auVar48);
      auVar50._8_8_ = 0;
      auVar50._0_8_ = dVar9 * dVar8;
      auVar39 = vfmsub231sd_fma(auVar50,auVar24,auVar42);
      auVar39 = vfmadd231sd_fma(auVar39,auVar34,auVar46);
      auVar44 = vfnmadd231sd_fma(auVar39,auVar31,auVar48);
      auVar52._8_8_ = 0;
      auVar52._0_8_ = dVar9 * *(double *)&peVar11->field_0x48;
      auVar39 = vfmsub231sd_fma(auVar52,auVar24,auVar46);
      auVar39 = vfnmadd231sd_fma(auVar39,auVar34,auVar42);
      auVar39 = vfmadd231sd_fma(auVar39,auVar28,auVar48);
      auVar35._8_8_ = 0;
      auVar35._0_8_ = dVar9 * *(double *)&peVar11->field_0x50;
      auVar24 = vfmsub231sd_fma(auVar35,auVar24,auVar48);
      auVar24 = vfmadd231sd_fma(auVar24,auVar31,auVar42);
      auVar24 = vfnmadd231sd_fma(auVar24,auVar28,auVar46);
      local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           auVar27._0_8_;
      local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           auVar44._0_8_;
      local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           auVar39._0_8_;
      local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
           auVar24._0_8_;
      ChMatrix33<double>::ChMatrix33(&local_270,(ChQuaternion<double> *)&local_1e0);
      if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
      }
      psVar15 = (this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar11 = psVar15[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var12 = psVar15[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
        }
      }
      auVar25._8_8_ = 0;
      auVar25._0_8_ = *(ulong *)&peVar11->field_0x38;
      dVar8 = *(double *)&peVar11->field_0x40;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = dVar8;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = *(double *)&peVar11->field_0x48;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = *(double *)&peVar11->field_0x50;
      dVar9 = (this->q_element_abs_rot).m_data[0];
      auVar40._8_8_ = 0;
      auVar40._0_8_ = dVar9;
      dVar1 = (this->q_element_abs_rot).m_data[1];
      auVar43._8_8_ = 0;
      auVar43._0_8_ = dVar1;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = dVar8 * dVar1;
      auVar27 = vfmadd231sd_fma(auVar45,auVar25,auVar40);
      auVar47._8_8_ = 0;
      auVar47._0_8_ = (this->q_element_abs_rot).m_data[2];
      auVar27 = vfmadd231sd_fma(auVar27,auVar32,auVar47);
      auVar49._8_8_ = 0;
      auVar49._0_8_ = (this->q_element_abs_rot).m_data[3];
      auVar27 = vfmadd231sd_fma(auVar27,auVar36,auVar49);
      auVar51._8_8_ = 0;
      auVar51._0_8_ = dVar9 * dVar8;
      auVar39 = vfmsub231sd_fma(auVar51,auVar25,auVar43);
      auVar39 = vfmadd231sd_fma(auVar39,auVar36,auVar47);
      auVar44 = vfnmadd231sd_fma(auVar39,auVar32,auVar49);
      auVar53._8_8_ = 0;
      auVar53._0_8_ = dVar9 * *(double *)&peVar11->field_0x48;
      auVar39 = vfmsub231sd_fma(auVar53,auVar25,auVar47);
      auVar39 = vfnmadd231sd_fma(auVar39,auVar36,auVar43);
      auVar39 = vfmadd231sd_fma(auVar39,auVar29,auVar49);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = dVar9 * *(double *)&peVar11->field_0x50;
      auVar24 = vfmsub231sd_fma(auVar37,auVar25,auVar49);
      auVar24 = vfmadd231sd_fma(auVar24,auVar32,auVar43);
      auVar24 = vfnmadd231sd_fma(auVar24,auVar29,auVar47);
      local_300.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_data = auVar27._0_8_;
      local_300.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value = auVar44._0_8_;
      local_300.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value = auVar39._0_8_;
      local_300.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .m_stride.m_outer.m_value = auVar24._0_8_;
      ChMatrix33<double>::ChMatrix33(&local_1e0,(ChQuaternion<double> *)&local_300);
      if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
      }
      local_360.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_360.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (ChMatrix33<double> **)0x0;
      local_360.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (ChMatrix33<double> **)0x0;
      local_300.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_data = (PointerType)local_180;
      std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
      _M_realloc_insert<chrono::ChMatrix33<double>*>
                ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)
                 &local_360,(iterator)0x0,(ChMatrix33<double> **)&local_300);
      if (local_360.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_360.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_300.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_data = (PointerType)&local_270;
        std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
        _M_realloc_insert<chrono::ChMatrix33<double>*>
                  ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>
                    *)&local_360,
                   (iterator)
                   local_360.
                   super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(ChMatrix33<double> **)&local_300);
      }
      else {
        *local_360.
         super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = &local_270;
        local_360.
        super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_360.
             super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      pCVar13 = local_348;
      if (local_360.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_360.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_300.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_data = (PointerType)local_180;
        std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
        _M_realloc_insert<chrono::ChMatrix33<double>*>
                  ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>
                    *)&local_360,
                   (iterator)
                   local_360.
                   super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(ChMatrix33<double> **)&local_300);
      }
      else {
        *local_360.
         super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = local_180;
        local_360.
        super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_360.
             super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      if (local_360.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_360.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_300.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_data = (PointerType)&local_1e0;
        std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
        _M_realloc_insert<chrono::ChMatrix33<double>*>
                  ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>
                    *)&local_360,
                   (iterator)
                   local_360.
                   super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(ChMatrix33<double> **)&local_300);
      }
      else {
        *local_360.
         super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = &local_1e0;
        local_360.
        super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_360.
             super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      local_300.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .m_stride.m_outer.m_value = 0;
      local_300.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
      m_data = (double *)0x0;
      local_300.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
      m_rows = 0;
      local_300.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
      m_cols = 0;
      local_300.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_data = local_370.m_storage.m_data;
      local_300.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value = local_370.m_storage.m_rows;
      local_300.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value = 1;
      if (local_370.m_storage.m_rows < 0 && local_370.m_storage.m_data != (double *)0x0) {
        pcVar16 = 
        "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
        ;
      }
      else {
        local_300.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .m_stride.m_outer.m_value = 1;
        local_220.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .m_stride.m_outer.m_value = 0;
        local_220.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_data = (pCVar13->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                  m_storage.m_data;
        local_220.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_rows.m_value =
             (pCVar13->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
        local_220.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_cols.m_value = 1;
        if (-1 < local_220.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 .
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                 .
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_rows.m_value ||
            local_220.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_data == (double *)0x0) {
          local_220.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .m_stride.m_outer.m_value = 1;
          ChMatrixCorotation::ComputeCK(&local_300,&local_360,4,&local_220);
          if (local_300.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data != (double *)0x0) {
            free((void *)local_300.m_object.
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                         m_data[-1]);
          }
          local_300.
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value = 0;
          local_300.
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_data = (PointerType)0x0;
          local_300.
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_rows.m_value = 0;
          local_2a8[5] = 0.0;
          local_2a8[3] = 0.0;
          local_2a8[4] = 0.0;
          psVar15 = (this->nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_finish != psVar15) {
            local_2b8 = (this->super_ChElementBeam).length * 0.5;
            lVar20 = 0x18;
            lVar14 = 0;
            uVar19 = 0;
            local_2c0 = this;
            do {
              peVar10 = (local_2c0->section).
                        super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
              local_2b0 = lVar20;
              ChFrameMoving<double>::GetWvel_loc
                        ((ChFrameMoving<double> *)
                         &((psVar15[uVar19].
                            super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->super_ChNodeFEAbase).field_0x18);
              (*(peVar10->super_ChBeamSection)._vptr_ChBeamSection[0x10])
                        (peVar10,&local_300,local_2a8 + 3,local_2a8);
              peVar11 = (local_2c0->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar19].
                        super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
              auVar26._8_8_ = 0;
              auVar26._0_8_ =
                   local_300.
                   super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                   .
                   super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                   .m_data;
              auVar2._8_8_ = 0;
              auVar2._0_8_ = *(ulong *)&peVar11->field_0x58;
              auVar33._8_8_ = 0;
              auVar33._0_8_ =
                   (double)local_300.
                           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                           .
                           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                           .m_rows.m_value * *(double *)&peVar11->field_0x60;
              auVar27 = vfmadd231sd_fma(auVar33,auVar26,auVar2);
              auVar38._8_8_ = 0;
              auVar38._0_8_ =
                   local_300.
                   super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                   .
                   super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                   .m_cols.m_value;
              auVar3._8_8_ = 0;
              auVar3._0_8_ = *(ulong *)&peVar11->field_0x68;
              auVar27 = vfmadd231sd_fma(auVar27,auVar38,auVar3);
              auVar4._8_8_ = 0;
              auVar4._0_8_ = *(ulong *)&peVar11->field_0x70;
              auVar41._8_8_ = 0;
              auVar41._0_8_ =
                   (double)local_300.
                           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                           .
                           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                           .m_rows.m_value * *(double *)&peVar11->field_0x78;
              auVar39 = vfmadd231sd_fma(auVar41,auVar26,auVar4);
              auVar5._8_8_ = 0;
              auVar5._0_8_ = *(ulong *)&peVar11->field_0x80;
              auVar39 = vfmadd231sd_fma(auVar39,auVar38,auVar5);
              auVar6._8_8_ = 0;
              auVar6._0_8_ = *(ulong *)&peVar11->field_0x88;
              auVar30._8_8_ = 0;
              auVar30._0_8_ =
                   (double)local_300.
                           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                           .
                           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                           .m_rows.m_value * *(double *)&peVar11->field_0x90;
              auVar24 = vfmadd231sd_fma(auVar30,auVar26,auVar6);
              auVar7._8_8_ = 0;
              auVar7._0_8_ = *(ulong *)&peVar11->field_0x98;
              auVar24 = vfmadd231sd_fma(auVar24,auVar38,auVar7);
              local_2a8[0] = auVar27._0_8_;
              local_2a8[1] = (double)auVar39._0_8_;
              local_2a8[2] = (double)auVar24._0_8_;
              if ((local_348->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                  m_storage.m_rows + -3 < (long)(uVar19 * 6)) {
LAB_00675c68:
                __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                              ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                              "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                             );
              }
              pdVar17 = (local_348->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_data;
              uVar18 = 3;
              if ((((ulong)(pdVar17 + uVar19 * 6) & 7) == 0) &&
                 (uVar18 = (ulong)(-((uint)((ulong)(pdVar17 + uVar19 * 6) >> 3) & 0x1fffffff) & 7),
                 2 < uVar18)) {
                uVar18 = 3;
              }
              if (uVar18 != 0) {
                uVar21 = 0;
                do {
                  *(double *)((long)pdVar17 + uVar21 * 8 + lVar14) =
                       *(double *)((long)pdVar17 + uVar21 * 8 + lVar14) -
                       local_2b8 * local_2a8[uVar21];
                  uVar21 = uVar21 + 1;
                } while (uVar18 != uVar21);
              }
              if (uVar18 < 3) {
                do {
                  *(double *)((long)pdVar17 + uVar18 * 8 + lVar14) =
                       *(double *)((long)pdVar17 + uVar18 * 8 + lVar14) -
                       local_2b8 * local_2a8[uVar18];
                  uVar18 = uVar18 + 1;
                } while (uVar18 != 3);
              }
              if ((local_348->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                  m_storage.m_rows + -3 < (long)(uVar19 * 6 + 3)) goto LAB_00675c68;
              pdVar17 = (local_348->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_data;
              uVar18 = 3;
              if ((((ulong)(pdVar17 + uVar19 * 6 + 3) & 7) == 0) &&
                 (uVar18 = (ulong)(-((uint)((ulong)(pdVar17 + uVar19 * 6 + 3) >> 3) & 0x1fffffff) &
                                  7), 2 < uVar18)) {
                uVar18 = 3;
              }
              if (uVar18 != 0) {
                uVar21 = 0;
                do {
                  *(double *)((long)pdVar17 + uVar21 * 8 + local_2b0) =
                       *(double *)((long)pdVar17 + uVar21 * 8 + local_2b0) -
                       local_2b8 * local_2a8[uVar21 + 3];
                  uVar21 = uVar21 + 1;
                } while (uVar18 != uVar21);
              }
              if (uVar18 < 3) {
                lVar20 = uVar18 + 3;
                do {
                  *(double *)((long)pdVar17 + lVar20 * 8 + lVar14) =
                       *(double *)((long)pdVar17 + lVar20 * 8 + lVar14) -
                       local_2b8 * local_2a8[lVar20];
                  lVar20 = lVar20 + 1;
                } while (lVar20 != 6);
              }
              uVar19 = uVar19 + 1;
              psVar15 = (local_2c0->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              lVar14 = lVar14 + 0x30;
              lVar20 = local_2b0 + 0x30;
            } while (uVar19 < (ulong)((long)(local_2c0->nodes).
                                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)psVar15 >> 4));
          }
          if (local_360.
              super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_360.
                            super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_360.
                                  super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_360.
                                  super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_318.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
              m_data != (double *)0x0) {
            free((void *)local_318.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                         m_storage.m_data[-1]);
          }
          if (local_340.m_storage.m_data != (double *)0x0) {
            free((void *)local_340.m_storage.m_data[-1]);
          }
          if (local_370.m_storage.m_data != (double *)0x0) {
            free((void *)local_370.m_storage.m_data[-1]);
          }
          if (local_330.m_storage.m_data != (double *)0x0) {
            free((void *)local_330.m_storage.m_data[-1]);
          }
          return;
        }
        pcVar16 = 
        "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
        ;
      }
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,pcVar16);
    }
  }
  pcVar16 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
  ;
LAB_00675dbb:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar16);
}

Assistant:

void ChElementBeamEuler::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    assert(Fi.size() == 12);
    assert(section);

    // set up vector of nodal displacements and small rotations (in local element system)
    ChVectorDynamic<> displ(12);
    this->GetStateBlock(displ);

    // [local Internal Forces] = [Klocal] * displ + [Rlocal] * displ_dt
    ChVectorDynamic<> Fi_local = Km * displ;

    // set up vector of nodal velocities (in local element system)
    ChVectorDynamic<> displ_dt(12);
    this->GetField_dt(displ_dt);

    // Rayleigh damping - stiffness proportional
    ChMatrixDynamic<> FiR_local = section->GetBeamRaleyghDampingBeta() * Km * displ_dt;

    Fi_local += FiR_local;

    // Rayleigh damping - mass proportional
    if (this->section->GetBeamRaleyghDampingAlpha()) {
        ChMatrixDynamic<> Mloc(12, 12);
        Mloc.setZero();
        ChMatrix33<> Mxw;

        // the "lumped" M mass matrix must be computed
        ChMatrixNM<double, 6, 6> sectional_mass;
        this->section->ComputeInertiaMatrix(sectional_mass);

        // Rayleigh damping (stiffness proportional part)  [Rm] = alpha*[M] 
        double node_multiplier_fact = 0.5 * length * (this->section->GetBeamRaleyghDampingAlpha());
        for (int i = 0; i < nodes.size(); ++i) {
            int stride = i * 6; 
            Mloc.block<6, 6>(stride, stride) += sectional_mass * node_multiplier_fact;
        }
        FiR_local = Mloc * displ_dt;
        Fi_local += FiR_local;
    }

    Fi_local *= -1.0;

    //
    // Corotate local internal loads
    //

    // Fi = C * Fi_local  with C block-diagonal rotations A  , for nodal forces in abs. frame
    ChMatrix33<> Atoabs(this->q_element_abs_rot);
    ChMatrix33<> AtolocwelA(this->GetNodeA()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
    ChMatrix33<> AtolocwelB(this->GetNodeB()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
    std::vector<ChMatrix33<>*> R;
    R.push_back(&Atoabs);
    R.push_back(&AtolocwelA);
    R.push_back(&Atoabs);
    R.push_back(&AtolocwelB);
    ChMatrixCorotation::ComputeCK(Fi_local, R, 4, Fi);


    // Add also inertial quadratic terms: gyroscopic and centrifugal
    
    // CASE OF LUMPED MASS - fast
    double node_multiplier = 0.5 * length;
    ChVector<> mFcent_i;
    ChVector<> mTgyro_i;
    for (int i = 0; i < nodes.size(); ++i) {
        this->section->ComputeQuadraticTerms(mFcent_i, mTgyro_i, nodes[i]->GetWvel_loc());
        Fi.segment(i * 6, 3)     -= node_multiplier * (nodes[i]->GetA() * mFcent_i).eigen();
        Fi.segment(3 + i * 6, 3) -= node_multiplier * mTgyro_i.eigen();
    }

#ifdef BEAM_VERBOSE
    GetLog() << "\nInternal forces (local): \n";
    for (int c = 0; c < 6; c++)
        GetLog() << FiK_local(c) << "  ";
    GetLog() << "\n";
    for (int c = 6; c < 12; c++)
        GetLog() << FiK_local(c) << "  ";
    GetLog() << "\n\nInternal forces (ABS) : \n";
    for (int c = 0; c < 6; c++)
        GetLog() << Fi(c) << "  ";
    GetLog() << "\n";
    for (int c = 6; c < 12; c++)
        GetLog() << Fi(c) << "  ";
    GetLog() << "\n";
#endif
}